

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_tests.cpp
# Opt level: O2

void __thiscall
compress_tests::compress_script_to_compressed_pubkey_id::test_method
          (compress_script_to_compressed_pubkey_id *this)

{
  long lVar1;
  size_type sVar2;
  CScript *this_00;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *other;
  undefined8 uVar3;
  iterator in_R8;
  iterator pvVar4;
  iterator pvVar5;
  iterator in_R9;
  bool *pbVar6;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *p_Var7;
  undefined8 uVar8;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  char *local_1f0;
  char *local_1e8;
  undefined1 *local_1e0;
  undefined1 *local_1d8;
  char *local_1d0;
  char *local_1c8;
  char *local_1c0;
  char *local_1b8;
  undefined1 *local_1b0;
  undefined1 *local_1a8;
  char *local_1a0;
  char *local_198;
  undefined4 local_18c;
  char *local_188;
  char *local_180;
  undefined1 *local_178;
  undefined1 *local_170;
  char *local_168;
  char *local_160;
  char *local_158;
  char *local_150;
  undefined1 *local_148;
  undefined1 *local_140;
  char *local_138;
  char *local_130;
  bool done;
  char *local_120;
  char *local_118;
  undefined1 *local_110;
  undefined1 *local_108;
  char *local_100;
  char *local_f8;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_f0;
  CKey key;
  CompressedScript out;
  undefined1 local_78 [24];
  char *pcStack_60;
  CScript script;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  GenerateRandomKey(SUB81(&key,0));
  local_78._16_8_ = 0;
  pcStack_60 = (char *)0x0;
  local_78._0_8_ = (char *)0x0;
  local_78._8_8_ = 0;
  CKey::GetPubKey((CPubKey *)&out,&key);
  ToByteVector<CPubKey>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_f0,(CPubKey *)&out);
  this_00 = CScript::operator<<((CScript *)local_78,
                                (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_f0);
  other = &CScript::operator<<(this_00,OP_CHECKSIG)->super_CScriptBase;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector(&script.super_CScriptBase,other);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_f0);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_78);
  local_100 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/compress_tests.cpp"
  ;
  local_f8 = "";
  local_110 = &boost::unit_test::basic_cstring<char_const>::null;
  local_108 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x6b;
  file.m_begin = (iterator)&local_100;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_110,msg);
  out._union._8_8_ = out._union._8_8_ & 0xffffffffffffff00;
  out._union.indirect_contents.indirect = (char *)&PTR__lazy_ostream_011480b0;
  out._union._16_8_ = boost::unit_test::lazy_ostream::inst;
  out._union._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_120 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/compress_tests.cpp"
  ;
  sVar2 = script.super_CScriptBase._size - 0x1d;
  if (script.super_CScriptBase._size < 0x1d) {
    sVar2 = script.super_CScriptBase._size;
  }
  local_118 = "";
  pvVar5 = local_78;
  local_78._0_4_ = sVar2;
  local_f0._M_impl.super__Vector_impl_data._M_start._0_4_ = 0x23;
  pvVar4 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
            (&out,&local_120,0x6b,1,2,pvVar5,"script.size()",&local_f0,"35U");
  out._union._16_8_ = 0;
  out._union._24_8_ = 0;
  out._union.indirect_contents.indirect = (char *)0x0;
  out._union._8_8_ = 0;
  out._union.direct[0x20] = '\0';
  out._size = 0;
  done = CompressScript(&script,&out);
  local_138 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/compress_tests.cpp"
  ;
  local_130 = "";
  local_148 = &boost::unit_test::basic_cstring<char_const>::null;
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x6f;
  file_00.m_begin = (iterator)&local_138;
  msg_00.m_end = pvVar5;
  msg_00.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_148,
             msg_00);
  local_78._8_8_ = local_78._8_8_ & 0xffffffffffffff00;
  local_78._0_8_ = &PTR__lazy_ostream_011480b0;
  local_78._16_8_ = boost::unit_test::lazy_ostream::inst;
  pcStack_60 = "";
  local_158 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/compress_tests.cpp"
  ;
  local_150 = "";
  local_f0._M_impl.super__Vector_impl_data._M_start._0_4_ =
       CONCAT31(local_f0._M_impl.super__Vector_impl_data._M_start._1_3_,1);
  pvVar5 = (iterator)0x2;
  pbVar6 = &done;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
            (local_78,&local_158,0x6f,1,2,pbVar6,"done",&local_f0,"true");
  local_168 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/compress_tests.cpp"
  ;
  local_160 = "";
  local_178 = &boost::unit_test::basic_cstring<char_const>::null;
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x72;
  file_01.m_begin = (iterator)&local_168;
  msg_01.m_end = pbVar6;
  msg_01.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_178,
             msg_01);
  local_78._8_8_ = local_78._8_8_ & 0xffffffffffffff00;
  local_78._0_8_ = &PTR__lazy_ostream_011480b0;
  local_78._16_8_ = boost::unit_test::lazy_ostream::inst;
  pcStack_60 = "";
  local_188 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/compress_tests.cpp"
  ;
  local_180 = "";
  local_f0._M_impl.super__Vector_impl_data._M_start._0_4_ = out._size - 0x22;
  if (out._size < 0x22) {
    local_f0._M_impl.super__Vector_impl_data._M_start._0_4_ = out._size;
  }
  p_Var7 = &local_f0;
  local_18c = 0x21;
  pvVar5 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
            (local_78,&local_188,0x72,1,2,p_Var7,"out.size()",&local_18c,"33U");
  local_1a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/compress_tests.cpp"
  ;
  local_198 = "";
  local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x73;
  file_02.m_begin = (iterator)&local_1a0;
  msg_02.m_end = (iterator)p_Var7;
  msg_02.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_1b0,
             msg_02);
  local_78._8_8_ = local_78._8_8_ & 0xffffffffffffff00;
  local_78._0_8_ = &PTR__lazy_ostream_011480b0;
  local_78._16_8_ = boost::unit_test::lazy_ostream::inst;
  pcStack_60 = "";
  local_1c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/compress_tests.cpp"
  ;
  local_1b8 = "";
  uVar3 = &out;
  if (0x21 < out._size) {
    uVar3 = out._union.indirect_contents.indirect;
  }
  uVar8 = &script;
  if (0x1c < script.super_CScriptBase._size) {
    uVar8 = script.super_CScriptBase._union.indirect_contents.indirect;
  }
  local_f0._M_impl.super__Vector_impl_data._M_start._0_4_ =
       (uint)(byte)(((CompressedScript *)uVar3)->_union).direct[0] -
       (uint)(byte)(((CScript *)uVar8)->super_CScriptBase)._union.direct[1];
  p_Var7 = &local_f0;
  local_18c = 0;
  pvVar5 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (local_78,&local_1c0,0x73,1,2,p_Var7,"memcmp(out.data(), script.data() + 1, 1)",
             &local_18c,"0");
  local_1d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/compress_tests.cpp"
  ;
  local_1c8 = "";
  local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x74;
  file_03.m_begin = (iterator)&local_1d0;
  msg_03.m_end = (iterator)p_Var7;
  msg_03.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_1e0,
             msg_03);
  local_78._8_8_ = local_78._8_8_ & 0xffffffffffffff00;
  local_78._0_8_ = &PTR__lazy_ostream_011480b0;
  local_78._16_8_ = boost::unit_test::lazy_ostream::inst;
  pcStack_60 = "";
  local_1f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/compress_tests.cpp"
  ;
  local_1e8 = "";
  uVar3 = out._union.indirect_contents.indirect;
  if (out._size < 0x22) {
    uVar3 = &out;
  }
  if (script.super_CScriptBase._size < 0x1d) {
    script.super_CScriptBase._union.indirect_contents.indirect = (char *)&script;
  }
  local_f0._M_impl.super__Vector_impl_data._M_start._0_4_ =
       memcmp((void *)((long)&((CompressedScript *)uVar3)->_union + 1),
              (void *)((long)&(((CScript *)
                               script.super_CScriptBase._union.indirect_contents.indirect)->
                              super_CScriptBase)._union + 2),0x20);
  local_18c = 0;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (local_78,&local_1f0,0x74,1,2,&local_f0,"memcmp(out.data() + 1, script.data() + 2, 32)",
             &local_18c,"0");
  prevector<33U,_unsigned_char,_unsigned_int,_int>::~prevector(&out);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&script.super_CScriptBase);
  std::
  unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ::~unique_ptr(&key.keydata);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(compress_script_to_compressed_pubkey_id)
{
    CKey key = GenerateRandomKey(); // case compressed PubKeyID

    CScript script = CScript() << ToByteVector(key.GetPubKey()) << OP_CHECKSIG; // COMPRESSED_PUBLIC_KEY_SIZE (33)
    BOOST_CHECK_EQUAL(script.size(), 35U);

    CompressedScript out;
    bool done = CompressScript(script, out);
    BOOST_CHECK_EQUAL(done, true);

    // Check compressed script
    BOOST_CHECK_EQUAL(out.size(), 33U);
    BOOST_CHECK_EQUAL(memcmp(out.data(), script.data() + 1, 1), 0);
    BOOST_CHECK_EQUAL(memcmp(out.data() + 1, script.data() + 2, 32), 0); // compare the 32 chars of the compressed CPubKey
}